

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readScatteringLaw.hpp
# Opt level: O1

ScatteringLaw * __thiscall
njoy::ENDFtk::section::Type<7,4>::
readScatteringLaw<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ScatteringLaw *__return_storage_ptr__,Type<7,4> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,double B1)

{
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  void *local_58;
  undefined8 uStack_50;
  long local_48;
  void *local_40;
  undefined8 uStack_38;
  long local_30;
  vector<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
  local_28;
  
  if ((B1 != 0.0) || (NAN(B1))) {
    TabulatedFunctions::TabulatedFunctions<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((TabulatedFunctions *)&local_88,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
      ._M_u = local_88;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 8) = uStack_80;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x10) = local_78;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x18) = uStack_70;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x20) = local_68;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x28) = uStack_60;
    *(void **)((long)&(__return_storage_ptr__->
                      super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      ).
                      super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      .
                      super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      .
                      super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      .
                      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      .
                      super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      ._M_u + 0x30) = local_58;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x38) = uStack_50;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     ._M_u + 0x40) = local_48;
    local_48 = 0;
    local_58 = (void *)0x0;
    uStack_50 = 0;
    *(void **)((long)&(__return_storage_ptr__->
                      super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      ).
                      super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      .
                      super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      .
                      super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      .
                      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      .
                      super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                      ._M_u + 0x48) = local_40;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x50) = uStack_38;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     ._M_u + 0x58) = local_30;
    local_30 = 0;
    local_40 = (void *)0x0;
    uStack_38 = 0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x60) =
         local_28.
         super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x68) =
         local_28.
         super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
             ._M_u + 0x70) =
         local_28.
         super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28.
    super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28.
    super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.
    super__Vector_base<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    ._M_index = '\x01';
    std::
    vector<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction,_std::allocator<njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions::ScatteringFunction>_>
    ::~vector(&local_28);
    if (local_40 != (void *)0x0) {
      operator_delete(local_40,local_30 - (long)local_40);
    }
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
    ._M_index = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

static ScatteringLaw
readScatteringLaw( Iterator& begin,
                   const Iterator& end,
                   long& lineNumber,
                   int MAT,
                   int MF,
                   int MT,
                   double B1 ) {

  if ( B1 == 0.0 ) {

    return AnalyticalFunctions();
  }
  else {
    
    return TabulatedFunctions( begin, end, lineNumber, MAT, MF, MT );
  }
}